

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O0

void aom_extend_frame_borders_plane_row_c(YV12_BUFFER_CONFIG *ybf,int plane,int v_start,int v_end)

{
  uint uVar1;
  int src_stride;
  int width;
  int extend_top;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int extend_bottom_border;
  int extend_top_border;
  int right;
  int bottom;
  int left;
  int top;
  int is_uv;
  int ss_y;
  int ss_x;
  int ext_size;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  byte local_54;
  byte local_4c;
  
  local_54 = (byte)*(undefined4 *)(in_RDI + 0x90);
  local_4c = (byte)*(undefined4 *)(in_RDI + 0x94);
  uVar1 = (uint)(0 < in_ESI);
  if (uVar1 == 0) {
    local_4c = 0;
  }
  src_stride = *(int *)(in_RDI + 0x80) >> (local_4c & 0x1f);
  if (uVar1 == 0) {
    local_54 = 0;
  }
  width = *(int *)(in_RDI + 0x80) >> (local_54 & 0x1f);
  extend_top = (src_stride + *(int *)(in_RDI + 8 + (long)(int)uVar1 * 4)) -
               *(int *)(in_RDI + 0x18 + (long)(int)uVar1 * 4);
  if ((*(uint *)(in_RDI + 0xc0) & 8) == 0) {
    if (in_EDX != 0) {
      src_stride = 0;
    }
    if (in_ECX != *(int *)(in_RDI + 0x18 + (long)(int)uVar1 * 4)) {
      extend_top = 0;
    }
    extend_plane(*(uint8_t **)(in_RDI + 0x28 + (long)in_ESI * 8),src_stride,width,src_stride,
                 extend_top,in_stack_ffffffffffffff5c,*(int *)(in_RDI + 0x10 + (long)(int)uVar1 * 4)
                 ,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  }
  else {
    extend_plane_high((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                      (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70
                      ,in_stack_ffffffffffffff6c,width,
                      (int)*(undefined8 *)(in_RDI + 0x28 + (long)in_ESI * 8),
                      *(int *)(in_RDI + 0x20 + (long)(int)uVar1 * 4),
                      *(int *)(in_RDI + 0x18 + (long)(int)uVar1 * 4));
  }
  return;
}

Assistant:

void aom_extend_frame_borders_plane_row_c(const YV12_BUFFER_CONFIG *ybf,
                                          int plane, int v_start, int v_end) {
  const int ext_size = ybf->border;
  const int ss_x = ybf->subsampling_x;
  const int ss_y = ybf->subsampling_y;

  assert(ybf->y_height - ybf->y_crop_height < 16);
  assert(ybf->y_width - ybf->y_crop_width < 16);
  assert(ybf->y_height - ybf->y_crop_height >= 0);
  assert(ybf->y_width - ybf->y_crop_width >= 0);

  const int is_uv = plane > 0;
  const int top = ext_size >> (is_uv ? ss_y : 0);
  const int left = ext_size >> (is_uv ? ss_x : 0);
  const int bottom = top + ybf->heights[is_uv] - ybf->crop_heights[is_uv];
  const int right = left + ybf->widths[is_uv] - ybf->crop_widths[is_uv];
  const int extend_top_border = (v_start == 0);
  const int extend_bottom_border = (v_end == ybf->crop_heights[is_uv]);

#if CONFIG_AV1_HIGHBITDEPTH
  if (ybf->flags & YV12_FLAG_HIGHBITDEPTH) {
    extend_plane_high(ybf->buffers[plane], ybf->strides[is_uv],
                      ybf->crop_widths[is_uv], ybf->crop_heights[is_uv],
                      extend_top_border ? top : 0, left,
                      extend_bottom_border ? bottom : 0, right, v_start, v_end);
    return;
  }
#endif

  extend_plane(ybf->buffers[plane], ybf->strides[is_uv],
               ybf->crop_widths[is_uv], ybf->crop_heights[is_uv],
               extend_top_border ? top : 0, left,
               extend_bottom_border ? bottom : 0, right, v_start, v_end);
}